

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

Utils * __thiscall r_code::Utils::GetString<r_code::Code>(Utils *this,Code *object,uint16_t index)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar5;
  undefined6 in_register_00000012;
  undefined8 extraout_RDX;
  allocator local_139;
  ulong local_138;
  uint64_t val;
  int i;
  uint8_t char_count;
  char buffer [255];
  uint16_t s_index;
  uint16_t index_local;
  Code *object_local;
  
  uVar5 = CONCAT62((int6)((ulong)this >> 0x10),index);
  (*(object->super__Object)._vptr__Object[5])
            (object,(ulong)index,CONCAT62(in_register_00000012,index),uVar5);
  uVar2 = r_code::Atom::asIndex();
  iVar4 = (*(object->super__Object)._vptr__Object[5])
                    (object,(ulong)uVar2,extraout_RDX,CONCAT62((int6)((ulong)uVar5 >> 0x10),uVar2));
  val._7_1_ = (byte)*(undefined4 *)CONCAT44(extraout_var,iVar4);
  *(undefined1 *)((long)&i + (ulong)val._7_1_) = 0;
  for (val._0_4_ = 0; (int)val < (int)(uint)val._7_1_; val._0_4_ = (int)val + 4) {
    lVar1 = (long)(int)val / 4;
    uVar3 = uVar2 + 1 + (short)lVar1;
    iVar4 = (*(object->super__Object)._vptr__Object[5])
                      (object,(ulong)uVar3,(long)(int)val % 4 & 0xffffffff,
                       CONCAT62((int6)((ulong)lVar1 >> 0x10),uVar3) & 0xffffffff);
    local_138 = r_code::Atom::operator_cast_to_unsigned_long
                          ((Atom *)CONCAT44(extraout_var_00,iVar4));
    *(char *)((long)&i + (long)(int)val) = (char)local_138;
    *(char *)((long)&i + (long)((int)val + 1)) = (char)(local_138 >> 8);
    *(char *)((long)&i + (long)((int)val + 2)) = (char)(local_138 >> 0x10);
    *(char *)((long)&i + (long)((int)val + 3)) = (char)(local_138 >> 0x18);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,(char *)&i,&local_139);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  return this;
}

Assistant:

static std::string GetString(const O *object, uint16_t index)
    {
        uint16_t s_index = object->code(index).asIndex();
        char buffer[255];
        uint8_t char_count = (object->code(s_index).atom & 0x000000FF);
        buffer[char_count] = 0;

        for (int i = 0; i < char_count; i += 4) {
            uint64_t val = object->code(s_index + 1 + i / 4);
            buffer[i] = (val & 0x000000ff);
            buffer[i + 1] = (val & 0x0000ff00) >> 8;
            buffer[i + 2] = (val & 0x00ff0000) >> 16;
            buffer[i + 3] = (val & 0xff000000) >> 24;
        }

        return std::string(buffer);
    }